

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O1

Token __thiscall slang::parsing::ParserBase::expect(ParserBase *this,TokenKind kind)

{
  pointer pTVar1;
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  bool bVar2;
  size_type sVar3;
  Token TVar4;
  Token actual;
  Token matchingDelim;
  Token local_58;
  Token local_40;
  Token local_30;
  
  TVar4 = peek(this);
  if (TVar4.kind == kind) {
    TVar4 = consume(this);
    return TVar4;
  }
  Token::Token(&local_58);
  bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(kind);
  if ((bVar2) &&
     (sVar3 = (this->openDelims).super_SmallVectorBase<slang::parsing::Token>.len, sVar3 != 0)) {
    bVar2 = slang::syntax::SyntaxFacts::isMatchingDelims
                      ((this->openDelims).super_SmallVectorBase<slang::parsing::Token>.data_
                       [sVar3 - 1].kind,kind);
    if (bVar2) {
      sVar3 = (this->openDelims).super_SmallVectorBase<slang::parsing::Token>.len;
      pTVar1 = (this->openDelims).super_SmallVectorBase<slang::parsing::Token>.data_ + (sVar3 - 1);
      local_58.kind = pTVar1->kind;
      local_58._2_1_ = pTVar1->field_0x2;
      local_58.numFlags.raw = (pTVar1->numFlags).raw;
      local_58.rawLen = pTVar1->rawLen;
      local_58.info = pTVar1->info;
      sVar3 = sVar3 - 1;
    }
    else {
      sVar3 = 0;
    }
    (this->openDelims).super_SmallVectorBase<slang::parsing::Token>.len = sVar3;
    Token::Token(&local_40);
    Token::Token(&local_30);
    (this->lastPoppedDelims).first.kind = local_40.kind;
    (this->lastPoppedDelims).first.field_0x2 = local_40._2_1_;
    (this->lastPoppedDelims).first.numFlags = (NumericTokenFlags)local_40.numFlags.raw;
    (this->lastPoppedDelims).first.rawLen = local_40.rawLen;
    (this->lastPoppedDelims).first.info = local_40.info;
    (this->lastPoppedDelims).second.kind = local_30.kind;
    (this->lastPoppedDelims).second.field_0x2 = local_30._2_1_;
    (this->lastPoppedDelims).second.numFlags = (NumericTokenFlags)local_30.numFlags.raw;
    (this->lastPoppedDelims).second.rawLen = local_30.rawLen;
    (this->lastPoppedDelims).second.info = local_30.info;
  }
  alloc = this->alloc;
  diagnostics = ((this->window).tokenSource)->diagnostics;
  actual = peek(this);
  TVar4.info = local_58.info;
  TVar4.kind = local_58.kind;
  TVar4._2_1_ = local_58._2_1_;
  TVar4.numFlags.raw = local_58.numFlags.raw;
  TVar4.rawLen = local_58.rawLen;
  TVar4 = Token::createExpected(alloc,diagnostics,actual,kind,(this->window).lastConsumed,TVar4);
  return TVar4;
}

Assistant:

Token ParserBase::expect(TokenKind kind) {
    if (peek(kind))
        return consume();

    // If this needs to be an end delimiter, see if we know the
    // corresponding open delimiter and if so use that to produce
    // a better error.
    Token matchingDelim;
    if (SF::isCloseDelimOrKeyword(kind) && !openDelims.empty()) {
        if (SF::isMatchingDelims(openDelims.back().kind, kind)) {
            matchingDelim = openDelims.back();
            openDelims.pop_back();
        }
        else {
            // If we hit this point assume that our stack of delims has
            // become unbalanced and flush it.
            openDelims.clear();
        }
        lastPoppedDelims = {};
    }

    Token result = Token::createExpected(alloc, getDiagnostics(), peek(), kind, window.lastConsumed,
                                         matchingDelim);
    return result;
}